

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O2

int raft_server_test::update_params_test(void)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  RaftPkg *pRVar3;
  int32 iVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  int __how;
  int __how_00;
  int __how_01;
  raft_params *prVar8;
  raft_params *prVar9;
  pointer ppRVar10;
  byte bVar11;
  initializer_list<RaftPkg_*> __l;
  hash<std::thread::id> local_569;
  ptr<FakeNetworkBase> f_base;
  id local_558;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  raft_params param;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  raft_params local_470;
  RaftPkg s1;
  RaftPkg s3;
  RaftPkg s2;
  
  bVar11 = 0;
  raft_functional_common::reset_log_files();
  std::make_shared<nuraft::FakeNetworkBase>();
  std::__cxx11::string::string((string *)&s1_addr,"S1",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s2_addr,"S2",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s3_addr,"S3",(allocator *)&s1);
  RaftPkg::RaftPkg(&s1,&f_base,1,&s1_addr);
  RaftPkg::RaftPkg(&s2,&f_base,2,&s2_addr);
  RaftPkg::RaftPkg(&s3,&f_base,3,&s3_addr);
  __l._M_len = 3;
  __l._M_array = (iterator)&param;
  param._0_8_ = &s1;
  param._8_8_ = &s2;
  param._16_8_ = &s3;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector(&pkgs,__l,(allocator_type *)&local_470)
  ;
  prVar8 = (raft_params *)0x0;
  iVar5 = launch_servers(&pkgs,(raft_params *)0x0,false);
  if (iVar5 == 0) {
    iVar5 = make_group(&pkgs);
    if (iVar5 == 0) {
      for (ppRVar10 = pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                      super__Vector_impl_data._M_start; iVar5 = (int)prVar8,
          ppRVar10 !=
          pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppRVar10 = ppRVar10 + 1) {
        pRVar3 = *ppRVar10;
        nuraft::raft_server::get_current_params
                  (&param,(pRVar3->raftServer).
                          super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  );
        iVar5 = param.election_timeout_upper_bound_ + 1;
        param.election_timeout_upper_bound_ = iVar5;
        nuraft::raft_server::update_params
                  ((pRVar3->raftServer).
                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&param
                  );
        nuraft::raft_server::get_current_params
                  (&local_470,
                   (pRVar3->raftServer).
                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        prVar8 = &local_470;
        prVar9 = &param;
        for (lVar7 = 0x67; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(char *)&prVar9->election_timeout_upper_bound_ =
               (char)prVar8->election_timeout_upper_bound_;
          prVar8 = (raft_params *)((long)prVar8 + (ulong)bVar11 * -2 + 1);
          prVar9 = (raft_params *)((long)prVar9 + (ulong)bVar11 * -2 + 1);
        }
        iVar4 = param.election_timeout_upper_bound_;
        if (iVar5 != param.election_timeout_upper_bound_) {
          poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar6 = std::operator<<(poVar6,"        time: ");
          poVar6 = std::operator<<(poVar6,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar6 = std::operator<<(poVar6,(string *)&local_470);
          poVar6 = std::operator<<(poVar6,"\x1b[0m");
          poVar6 = std::operator<<(poVar6,"\n");
          poVar6 = std::operator<<(poVar6,"      thread: ");
          poVar6 = std::operator<<(poVar6,"\x1b[33m");
          pp_Var1 = poVar6->_vptr_basic_ostream;
          p_Var2 = pp_Var1[-3];
          *(uint *)(&poVar6->field_0x18 + (long)p_Var2) =
               *(uint *)(&poVar6->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
          *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var1[-3]) = 4;
          poVar6 = std::operator<<(poVar6,0x30);
          local_558._M_thread = pthread_self();
          std::hash<std::thread::id>::operator()(&local_569,&local_558);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
               *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 |
               2;
          poVar6 = std::operator<<(poVar6,"\x1b[0m");
          poVar6 = std::operator<<(poVar6,"\n");
          poVar6 = std::operator<<(poVar6,"          in: ");
          poVar6 = std::operator<<(poVar6,"\x1b[36m");
          poVar6 = std::operator<<(poVar6,"update_params_test");
          poVar6 = std::operator<<(poVar6,"()\x1b[0m");
          poVar6 = std::operator<<(poVar6,"\n");
          poVar6 = std::operator<<(poVar6,"          at: ");
          poVar6 = std::operator<<(poVar6,"\x1b[32m");
          poVar6 = std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                  );
          poVar6 = std::operator<<(poVar6,"\x1b[0m:");
          poVar6 = std::operator<<(poVar6,"\x1b[1;35m");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xff);
          poVar6 = std::operator<<(poVar6,"\x1b[0m");
          poVar6 = std::operator<<(poVar6,"\n");
          poVar6 = std::operator<<(poVar6,
                                   "    value of: \x1b[1;34mparam.election_timeout_upper_bound_\x1b[0m\n"
                                  );
          poVar6 = std::operator<<(poVar6,"    expected: \x1b[1;32m");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
          poVar6 = std::operator<<(poVar6,"\x1b[0m\n");
          poVar6 = std::operator<<(poVar6,"      actual: \x1b[1;31m");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          std::operator<<(poVar6,"\x1b[0m\n");
          std::__cxx11::string::~string((string *)&local_470);
          TestSuite::failHandler();
          iVar5 = -1;
          goto LAB_0010ed17;
        }
      }
      print_stats(&pkgs);
      nuraft::raft_server::shutdown
                (s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,iVar5,__how);
      nuraft::raft_server::shutdown
                (s2.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,iVar5,__how_00);
      nuraft::raft_server::shutdown
                (s3.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,iVar5,__how_01);
      iVar5 = 0;
      nuraft::FakeNetworkBase::destroy
                (f_base.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    else {
      poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar6 = std::operator<<(poVar6,"        time: ");
      poVar6 = std::operator<<(poVar6,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar6 = std::operator<<(poVar6,(string *)&param);
      poVar6 = std::operator<<(poVar6,"\x1b[0m");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"      thread: ");
      poVar6 = std::operator<<(poVar6,"\x1b[33m");
      pp_Var1 = poVar6->_vptr_basic_ostream;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar6->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar6->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var1[-3]) = 4;
      poVar6 = std::operator<<(poVar6,0x30);
      local_470._0_8_ = pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_558,(id *)&local_470);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar6 = std::operator<<(poVar6,"\x1b[0m");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"          in: ");
      poVar6 = std::operator<<(poVar6,"\x1b[36m");
      poVar6 = std::operator<<(poVar6,"update_params_test");
      poVar6 = std::operator<<(poVar6,"()\x1b[0m");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"          at: ");
      poVar6 = std::operator<<(poVar6,"\x1b[32m");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar6 = std::operator<<(poVar6,"\x1b[0m:");
      poVar6 = std::operator<<(poVar6,"\x1b[1;35m");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf5);
      poVar6 = std::operator<<(poVar6,"\x1b[0m");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"    value of: \x1b[1;34mmake_group( pkgs )\x1b[0m\n");
      poVar6 = std::operator<<(poVar6,"    expected: \x1b[1;32m");
      poVar6 = std::operator<<(poVar6,"0");
      poVar6 = std::operator<<(poVar6,"\x1b[0m\n");
      poVar6 = std::operator<<(poVar6,"      actual: \x1b[1;31m");
      iVar5 = -1;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
      std::operator<<(poVar6,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&param);
      TestSuite::failHandler();
    }
  }
  else {
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar6 = std::operator<<(poVar6,"        time: ");
    poVar6 = std::operator<<(poVar6,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar6 = std::operator<<(poVar6,(string *)&param);
    poVar6 = std::operator<<(poVar6,"\x1b[0m");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"      thread: ");
    poVar6 = std::operator<<(poVar6,"\x1b[33m");
    pp_Var1 = poVar6->_vptr_basic_ostream;
    p_Var2 = pp_Var1[-3];
    *(uint *)(&poVar6->field_0x18 + (long)p_Var2) =
         *(uint *)(&poVar6->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var1[-3]) = 4;
    poVar6 = std::operator<<(poVar6,0x30);
    local_470._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_558,(id *)&local_470);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar6 = std::operator<<(poVar6,"\x1b[0m");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"          in: ");
    poVar6 = std::operator<<(poVar6,"\x1b[36m");
    poVar6 = std::operator<<(poVar6,"update_params_test");
    poVar6 = std::operator<<(poVar6,"()\x1b[0m");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"          at: ");
    poVar6 = std::operator<<(poVar6,"\x1b[32m");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar6 = std::operator<<(poVar6,"\x1b[0m:");
    poVar6 = std::operator<<(poVar6,"\x1b[1;35m");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf4);
    poVar6 = std::operator<<(poVar6,"\x1b[0m");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n");
    poVar6 = std::operator<<(poVar6,"    expected: \x1b[1;32m");
    poVar6 = std::operator<<(poVar6,"0");
    poVar6 = std::operator<<(poVar6,"\x1b[0m\n");
    poVar6 = std::operator<<(poVar6,"      actual: \x1b[1;31m");
    iVar5 = -1;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
    std::operator<<(poVar6,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&param);
    TestSuite::failHandler();
  }
LAB_0010ed17:
  std::_Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>::~_Vector_base
            (&pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>);
  RaftPkg::~RaftPkg(&s3);
  RaftPkg::~RaftPkg(&s2);
  RaftPkg::~RaftPkg(&s1);
  std::__cxx11::string::~string((string *)&s3_addr);
  std::__cxx11::string::~string((string *)&s2_addr);
  std::__cxx11::string::~string((string *)&s1_addr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f_base.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar5;
}

Assistant:

int update_params_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3};

    CHK_Z( launch_servers( pkgs ) );
    CHK_Z( make_group( pkgs ) );

    for (auto& entry: pkgs) {
        RaftPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        int old_value = param.election_timeout_upper_bound_;
        param.with_election_timeout_upper( old_value + 1 );
        pp->raftServer->update_params(param);

        param = pp->raftServer->get_current_params();
        CHK_EQ( old_value + 1, param.election_timeout_upper_bound_ );
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();

    f_base->destroy();

    return 0;
}